

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O0

int ArgPos(char *str,int argc,char **argv)

{
  int iVar1;
  int local_2c;
  int a;
  char **argv_local;
  int argc_local;
  char *str_local;
  
  local_2c = 1;
  while( true ) {
    if (argc <= local_2c) {
      return -1;
    }
    iVar1 = strcmp(str,argv[local_2c]);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  if (local_2c != argc + -1) {
    return local_2c;
  }
  printf("Argument missing for %s\n",str);
  exit(1);
}

Assistant:

int ArgPos(char *str, int argc, char **argv) {
  int a;
  for (a = 1; a < argc; a++) if (!strcmp(str, argv[a])) {
    if (a == argc - 1) {
      printf("Argument missing for %s\n", str);
      exit(1);
    }
    return a;
  }
  return -1;
}